

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O1

void __thiscall unit_test::main(unit_test *this,string *path)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  char local_55;
  int local_54;
  request local_50;
  undefined7 uStack_4f;
  long local_48;
  undefined1 local_40 [16];
  
  iVar1 = std::__cxx11::string::compare((char *)path);
  if (iVar1 == 0) {
    iVar1 = cppcms::application::response();
    cppcms::http::response::status(iVar1);
  }
  iVar1 = std::__cxx11::string::compare((char *)path);
  uVar2 = cppcms::application::response();
  local_54 = iVar1;
  if (iVar1 == 0) {
    cppcms::http::response::io_mode(uVar2,0);
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"path=",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(path->_M_dataplus)._M_p,path->_M_string_length);
    local_50 = (request)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
    cppcms::application::response();
    cppcms::http::response::out();
    std::ostream::flush();
  }
  else {
    poVar3 = (ostream *)cppcms::http::response::out();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"path=",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(path->_M_dataplus)._M_p,path->_M_string_length);
    local_50 = (request)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
  }
  cppcms::application::response();
  poVar3 = (ostream *)cppcms::http::response::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"method=",7);
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_(&local_50);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT71(uStack_4f,local_50),local_48);
  local_55 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_55,1);
  if ((undefined1 *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((undefined1 *)CONCAT71(uStack_4f,local_50));
  }
  if (local_54 == 0) {
    cppcms::application::response();
    cppcms::http::response::out();
    std::ostream::flush();
  }
  cppcms::application::request();
  lVar4 = cppcms::http::request::post_abi_cxx11_();
  p_Var5 = *(_Rb_tree_node_base **)(lVar4 + 0x18);
  cppcms::application::request();
  lVar4 = cppcms::http::request::post_abi_cxx11_();
  if (p_Var5 != (_Rb_tree_node_base *)(lVar4 + 8)) {
    do {
      cppcms::application::response();
      poVar3 = (ostream *)cppcms::http::response::out();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"=",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,*(char **)(p_Var5 + 2),(long)p_Var5[2]._M_parent);
      local_50 = (request)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_50,1);
      if (local_54 == 0) {
        cppcms::application::response();
        cppcms::http::response::out();
        std::ostream::flush();
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != (_Rb_tree_node_base *)(lVar4 + 8));
  }
  return;
}

Assistant:

virtual void main(std::string path)
	{
		bool flush=false;

		if(path=="/status")
			response().status(201);
		if(path=="/chunks")
			flush=true;

		if(flush)
			response().io_mode(cppcms::http::response::normal);
		response().out()<< "path=" << path << '\n' ;
		if(flush)
			response().out() << std::flush;

		response().out()<< "method=" << request().request_method() << '\n';
		if(flush)
			response().out() << std::flush;
		for(cppcms::http::request::form_type::const_iterator p=request().post().begin(),e=request().post().end();p!=e;++p){
			response().out() << p->first <<"=" << p->second << '\n';
			if(flush)
				response().out() << std::flush;
		}
	}